

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall Hpipe::Instruction::update_in_a_cycle(Instruction *this)

{
  uint uVar1;
  Instruction *pIVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  pair<Hpipe::Instruction_*,_unsigned_int> *ppVar7;
  Transition *__args;
  int local_60;
  uint local_5c;
  Instruction *pIStack_58;
  uint j;
  pair<Hpipe::Instruction_*,_unsigned_int> t;
  int local_34;
  Instruction *local_30;
  undefined1 local_28 [8];
  Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> stack;
  Instruction *this_local;
  
  cur_op_id = cur_op_id + 1;
  stack.
  super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  .
  super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_>::Vec
            ((Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> *)local_28);
  local_34 = 0;
  local_30 = this;
  std::
  vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
  ::emplace_back<Hpipe::Instruction*,int>
            ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
              *)local_28,&local_30,&local_34);
  do {
    pvVar4 = std::
             vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
             ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                     *)local_28);
    pIStack_58 = pvVar4->first;
    t.first = *(Instruction **)&pvVar4->second;
    if (pIStack_58->op_id == cur_op_id) {
      std::
      vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      ::pop_back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                  *)local_28);
      if (-1 < pIStack_58->num_in_dfs_stack) {
        for (local_5c = pIStack_58->num_in_dfs_stack; uVar5 = (ulong)local_5c,
            sVar6 = std::
                    vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                    ::size((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                            *)local_28), uVar5 < sVar6; local_5c = local_5c + 1) {
          ppVar7 = Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_>::operator[]
                             ((Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> *)local_28,
                              local_5c);
          ppVar7->first->in_a_cycle = true;
        }
      }
    }
    else {
      pIStack_58->op_id = cur_op_id;
      sVar6 = std::
              vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
              ::size((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                      *)local_28);
      pIStack_58->num_in_dfs_stack = (int)sVar6 + -1;
    }
    while( true ) {
      pvVar4 = std::
               vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
               ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                       *)local_28);
      uVar1 = pvVar4->second;
      pvVar4 = std::
               vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
               ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                       *)local_28);
      sVar6 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                        (&(pvVar4->first->next).
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      if (uVar1 < sVar6) break;
      pvVar4 = std::
               vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
               ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                       *)local_28);
      pvVar4->first->num_in_dfs_stack = -1;
      std::
      vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      ::pop_back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                  *)local_28);
      bVar3 = std::
              vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
              ::empty((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                       *)local_28);
      if (bVar3) {
        Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_>::~Vec
                  ((Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> *)local_28);
        return;
      }
    }
    pvVar4 = std::
             vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
             ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                     *)local_28);
    pIVar2 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
             ::back((vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                     *)local_28);
    uVar1 = pvVar4->second;
    pvVar4->second = uVar1 + 1;
    __args = Vec<Hpipe::Transition>::operator[](&pIVar2->next,uVar1);
    local_60 = 0;
    std::
    vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
    ::emplace_back<Hpipe::Instruction*&,int>
              ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
                *)local_28,&__args->inst,&local_60);
  } while( true );
}

Assistant:

void Instruction::update_in_a_cycle() {
    ++Instruction::cur_op_id;
    Vec<std::pair<Instruction *,unsigned>> stack;
    stack.emplace_back( this, 0 );
    while ( true ) {
        std::pair<Instruction *,unsigned> t = stack.back();

        // instruction
        if ( t.first->op_id == Instruction::cur_op_id ) {
            stack.pop_back();
            if ( t.first->num_in_dfs_stack >= 0 )
                for( unsigned j = t.first->num_in_dfs_stack; j < stack.size(); ++j )
                    stack[ j ].first->in_a_cycle = true;
        } else {
            t.first->op_id = Instruction::cur_op_id;
            t.first->num_in_dfs_stack = stack.size() - 1;
        }

        // next
        while ( stack.back().second >= stack.back().first->next.size() ) {
            stack.back().first->num_in_dfs_stack = - 1;
            stack.pop_back();
            if ( stack.empty() )
                return;
        }
        stack.emplace_back( stack.back().first->next[ stack.back().second++ ].inst, 0 );
    }
}